

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::handleExceptionMatchExpr
               (AssertionHandler *handler,StringMatcher *matcher,StringRef *matcherString)

{
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  expr;
  string exceptionMessage;
  ITransientExpression *in_stack_ffffffffffffff78;
  AssertionHandler *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  *in_stack_ffffffffffffff90;
  
  this = (AssertionHandler *)&stack0xffffffffffffffc8;
  translateActiveException_abi_cxx11_();
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::MatchExpr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
              (MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,(StringRef *)in_stack_ffffffffffffff78);
  AssertionHandler::handleExpr(this,in_stack_ffffffffffffff78);
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~MatchExpr((MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                *)0x123621);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, StringMatcher const& matcher, StringRef const& matcherString  ) {
        std::string exceptionMessage = Catch::translateActiveException();
        MatchExpr<std::string, StringMatcher const&> expr( exceptionMessage, matcher, matcherString );
        handler.handleExpr( expr );
    }